

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O0

size_t __thiscall
axl::sl::Array<char,_axl::sl::ArrayDetails<char>_>::insert
          (Array<char,_axl::sl::ArrayDetails<char>_> *this,size_t index,char *p,size_t count)

{
  bool bVar1;
  SimpleArrayDetails<char> *this_00;
  EVP_PKEY_CTX *in_RCX;
  EVP_PKEY_CTX *in_RDX;
  long in_RDI;
  char *dst;
  Ptr<void> shadow;
  BufHdr *in_stack_ffffffffffffff78;
  Ptr<void> *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  BufHdr *in_stack_ffffffffffffffa0;
  Array<char,_axl::sl::ArrayDetails<char>_> *in_stack_ffffffffffffffa8;
  size_t local_8;
  
  if (in_RCX == (EVP_PKEY_CTX *)0x0) {
    local_8 = *(size_t *)(in_RDI + 0x10);
  }
  else {
    rc::Ptr<void>::Ptr((Ptr<void> *)0x15082d);
    if ((*(long *)(in_RDI + 8) != 0) &&
       (bVar1 = rc::BufHdr::isInsideBuffer
                          (in_stack_ffffffffffffffa0,
                           (void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)),
       bVar1)) {
      rc::Ptr<void>::Ptr<axl::rc::BufHdr>(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      rc::Ptr<void>::operator=(in_stack_ffffffffffffff80,(Ptr<void> *)in_stack_ffffffffffffff78);
      rc::Ptr<void>::~Ptr((Ptr<void> *)0x150890);
    }
    this_00 = (SimpleArrayDetails<char> *)
              insertSpace(in_stack_ffffffffffffffa8,(size_t)in_stack_ffffffffffffffa0,
                          CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    if (this_00 == (SimpleArrayDetails<char> *)0x0) {
      local_8 = 0xffffffffffffffff;
    }
    else {
      if (in_RDX != (EVP_PKEY_CTX *)0x0) {
        SimpleArrayDetails<char>::copy(this_00,in_RDX,in_RCX);
      }
      local_8 = *(size_t *)(in_RDI + 0x10);
    }
    rc::Ptr<void>::~Ptr((Ptr<void> *)0x150944);
  }
  return local_8;
}

Assistant:

size_t
	insert(
		size_t index,
		const T* p,
		size_t count
	) {
		if (count == 0)
			return this->m_count;

		rc::Ptr<void> shadow;
		if (this->m_hdr && this->m_hdr->isInsideBuffer(p))
			shadow = this->m_hdr; // ensure we keep p intact

		T* dst = insertSpace(index, count);
		if (!dst)
			return -1;

		if (p)
			Details::copy(dst, p, count);

		return this->m_count;
	}